

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_key
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,key_type *key)

{
  scanner_storage *psVar1;
  byte __c;
  pointer pcVar2;
  size_type sVar3;
  char cVar4;
  size_type sVar5;
  location loc;
  region reg;
  repeat_at_least local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  char *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  char local_f8;
  undefined7 uStack_f7;
  undefined8 local_f0;
  serializer<toml::type_config> *local_e8;
  location local_e0;
  undefined1 local_98 [104];
  
  if (key->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"\"","");
  }
  else {
    pcVar2 = (key->_M_dataplus)._M_p;
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar2,pcVar2 + key->_M_string_length);
    local_98._8_8_ = local_100;
    local_98._16_8_ = CONCAT71(uStack_f7,local_f8);
    if (local_108 == &local_f8) {
      local_98._0_8_ = local_98 + 0x10;
      local_98._24_8_ = local_f0;
    }
    else {
      local_98._0_8_ = local_108;
      local_108 = &local_f8;
    }
    local_f8 = '\0';
    local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    make_temporary_location(&local_e0,(string *)local_98);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
    }
    syntax::unquoted_key(&local_130,&this->spec_);
    repeat_at_least::scan((region *)local_98,&local_130,&local_e0);
    if (local_130.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
        (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_130.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
    }
    if (((char *)local_98._0_8_ == (char *)0x0) ||
       (local_e0.location_ <
        (ulong)((long)((local_e0.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)((local_e0.source_.
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start))) {
      local_110 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_110;
      local_e8 = this;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
      sVar3 = key->_M_string_length;
      if (sVar3 != 0) {
        pcVar2 = (key->_M_dataplus)._M_p;
        psVar1 = &local_130.other_;
        sVar5 = 0;
        do {
          __c = pcVar2[sVar5];
          switch(__c) {
          case 8:
            local_130.super_scanner_base._vptr_scanner_base = (_func_int **)psVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\b","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,(char *)local_130.super_scanner_base._vptr_scanner_base
                      ,local_130.length_);
            break;
          case 9:
            local_130.super_scanner_base._vptr_scanner_base = (_func_int **)psVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\t","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,(char *)local_130.super_scanner_base._vptr_scanner_base
                      ,local_130.length_);
            break;
          case 10:
            local_130.super_scanner_base._vptr_scanner_base = (_func_int **)psVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\n","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,(char *)local_130.super_scanner_base._vptr_scanner_base
                      ,local_130.length_);
            break;
          case 0xb:
switchD_0039003d_caseD_b:
            if ((__c < 9) || (__c == 0x7f || (byte)(__c - 10) < 0x16)) {
              if ((local_e8->spec_).v1_1_0_add_escape_sequence_x == true) {
                local_130.super_scanner_base._vptr_scanner_base = (_func_int **)psVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\x","");
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,
                            (char *)local_130.super_scanner_base._vptr_scanner_base,
                            local_130.length_);
              }
              else {
                local_130.super_scanner_base._vptr_scanner_base = (_func_int **)psVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\u00","");
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __return_storage_ptr__,
                            (char *)local_130.super_scanner_base._vptr_scanner_base,
                            local_130.length_);
              }
              if ((scanner_storage *)local_130.super_scanner_base._vptr_scanner_base != psVar1) {
                operator_delete(local_130.super_scanner_base._vptr_scanner_base,
                                (ulong)((long)(_func_int ***)
                                              local_130.other_.scanner_._M_t.
                                              super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                                              .
                                              super__Head_base<0UL,_toml::detail::scanner_base_*,_false>
                                              ._M_head_impl + 1));
              }
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,__c >> 4 | 0x30);
              cVar4 = '0';
              if (9 < (__c & 0xf)) {
                cVar4 = '7';
              }
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,(__c & 0xf) + cVar4);
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,__c);
            }
            goto LAB_00390226;
          case 0xc:
            local_130.super_scanner_base._vptr_scanner_base = (_func_int **)psVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\f","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,(char *)local_130.super_scanner_base._vptr_scanner_base
                      ,local_130.length_);
            break;
          case 0xd:
            local_130.super_scanner_base._vptr_scanner_base = (_func_int **)psVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\r","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,(char *)local_130.super_scanner_base._vptr_scanner_base
                      ,local_130.length_);
            break;
          default:
            if (__c == 0x22) {
              local_130.super_scanner_base._vptr_scanner_base = (_func_int **)psVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\\"","");
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,
                        (char *)local_130.super_scanner_base._vptr_scanner_base,local_130.length_);
            }
            else {
              if (__c != 0x5c) goto switchD_0039003d_caseD_b;
              local_130.super_scanner_base._vptr_scanner_base = (_func_int **)psVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\\\\","");
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__,
                        (char *)local_130.super_scanner_base._vptr_scanner_base,local_130.length_);
            }
          }
          if ((scanner_storage *)local_130.super_scanner_base._vptr_scanner_base != psVar1) {
            operator_delete(local_130.super_scanner_base._vptr_scanner_base,
                            (ulong)((long)local_130.other_.scanner_._M_t.
                                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                                          .
                                          super__Head_base<0UL,_toml::detail::scanner_base_*,_false>
                                          ._M_head_impl + 1));
          }
LAB_00390226:
          sVar5 = sVar5 + 1;
        } while (sVar3 != sVar5);
      }
      local_130.super_scanner_base._vptr_scanner_base = (_func_int **)&local_130.other_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"\"","");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,(char *)local_130.super_scanner_base._vptr_scanner_base,
                local_130.length_);
      if ((scanner_storage *)local_130.super_scanner_base._vptr_scanner_base != &local_130.other_) {
        operator_delete(local_130.super_scanner_base._vptr_scanner_base,
                        (ulong)((long)local_130.other_.scanner_._M_t.
                                      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                                      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>.
                                      _M_head_impl + 1));
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (key->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + key->_M_string_length);
    }
    region::~region((region *)local_98);
    location::~location(&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type format_key(const key_type& key) // {{{
    {
        if(key.empty())
        {
            return string_conv<string_type>("\"\"");
        }

        // check the key can be a bare (unquoted) key
        auto loc = detail::make_temporary_location(string_conv<std::string>(key));
        auto reg = detail::syntax::unquoted_key(this->spec_).scan(loc);
        if(reg.is_ok() && loc.eof())
        {
            return key;
        }

        //if it includes special characters, then format it in a "quoted" key.
        string_type formatted = string_conv<string_type>("\"");
        for(const char_type c : key)
        {
            switch(c)
            {
                case char_type('\\'): {formatted += string_conv<string_type>("\\\\"); break;}
                case char_type('\"'): {formatted += string_conv<string_type>("\\\""); break;}
                case char_type('\b'): {formatted += string_conv<string_type>("\\b" ); break;}
                case char_type('\t'): {formatted += string_conv<string_type>("\\t" ); break;}
                case char_type('\f'): {formatted += string_conv<string_type>("\\f" ); break;}
                case char_type('\n'): {formatted += string_conv<string_type>("\\n" ); break;}
                case char_type('\r'): {formatted += string_conv<string_type>("\\r" ); break;}
                default  :
                {
                    // ASCII ctrl char
                    if( (char_type(0x00) <= c && c <= char_type(0x08)) ||
                        (char_type(0x0A) <= c && c <= char_type(0x1F)) ||
                        c == char_type(0x7F))
                    {
                        if(spec_.v1_1_0_add_escape_sequence_x)
                        {
                            formatted += string_conv<string_type>("\\x");
                        }
                        else
                        {
                            formatted += string_conv<string_type>("\\u00");
                        }
                        const auto c1 = c / 16;
                        const auto c2 = c % 16;
                        formatted += static_cast<char_type>('0' + c1);
                        if(c2 < 10)
                        {
                            formatted += static_cast<char_type>('0' + c2);
                        }
                        else // 10 <= c2
                        {
                            formatted += static_cast<char_type>('A' + (c2 - 10));
                        }
                    }
                    else
                    {
                        formatted += c;
                    }
                    break;
                }
            }
        }
        formatted += string_conv<string_type>("\"");
        return formatted;
    }